

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_316fba::Handlers::ignoreItem(Handlers *this)

{
  JSONHandler *this_00;
  anon_class_1_0_00000001 local_31;
  json_handler_t local_30;
  Handlers *local_10;
  Handlers *this_local;
  
  this_00 = this->jh;
  local_10 = this;
  std::function<void(std::__cxx11::string_const&,JSON)>::
  function<(anonymous_namespace)::Handlers::ignoreItem()::__0,void>
            ((function<void(std::__cxx11::string_const&,JSON)> *)&local_30,&local_31);
  JSONHandler::addAnyHandler(this_00,&local_30);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
  ::~function(&local_30);
  return;
}

Assistant:

void
Handlers::ignoreItem()
{
    jh->addAnyHandler([](std::string const&, JSON) {});
}